

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool cmDependsFortranParser_FilePop(cmDependsFortranParser *parser)

{
  bool bVar1;
  reference pvVar2;
  YY_BUFFER_STATE_conflict b;
  YY_BUFFER_STATE current;
  undefined1 local_48 [8];
  cmDependsFortranFile f;
  cmDependsFortranParser *parser_local;
  
  f.Directory.field_2._8_8_ = parser;
  bVar1 = std::
          stack<cmDependsFortranFile,_std::deque<cmDependsFortranFile,_std::allocator<cmDependsFortranFile>_>_>
          ::empty(&parser->FileStack);
  if (!bVar1) {
    pvVar2 = std::
             stack<cmDependsFortranFile,_std::deque<cmDependsFortranFile,_std::allocator<cmDependsFortranFile>_>_>
             ::top((stack<cmDependsFortranFile,_std::deque<cmDependsFortranFile,_std::allocator<cmDependsFortranFile>_>_>
                    *)(f.Directory.field_2._8_8_ + 0x10));
    cmDependsFortranFile::cmDependsFortranFile((cmDependsFortranFile *)local_48,pvVar2);
    std::
    stack<cmDependsFortranFile,_std::deque<cmDependsFortranFile,_std::allocator<cmDependsFortranFile>_>_>
    ::pop((stack<cmDependsFortranFile,_std::deque<cmDependsFortranFile,_std::allocator<cmDependsFortranFile>_>_>
           *)(f.Directory.field_2._8_8_ + 0x10));
    fclose((FILE *)local_48);
    b = cmDependsFortranLexer_GetCurrentBuffer(*(yyscan_t *)(f.Directory.field_2._8_8_ + 8));
    cmDependsFortran_yy_delete_buffer(b,*(yyscan_t *)(f.Directory.field_2._8_8_ + 8));
    cmDependsFortran_yy_switch_to_buffer
              ((YY_BUFFER_STATE_conflict)f.File,*(yyscan_t *)(f.Directory.field_2._8_8_ + 8));
    cmDependsFortranFile::~cmDependsFortranFile((cmDependsFortranFile *)local_48);
  }
  parser_local._7_1_ = !bVar1;
  return parser_local._7_1_;
}

Assistant:

bool cmDependsFortranParser_FilePop(cmDependsFortranParser* parser)
{
  // Pop one file off the stack and close it.  Switch the lexer back
  // to the next one on the stack.
  if(parser->FileStack.empty())
    {
    return 0;
    }
  else
    {
    cmDependsFortranFile f = parser->FileStack.top(); parser->FileStack.pop();
    fclose(f.File);
    YY_BUFFER_STATE current =
      cmDependsFortranLexer_GetCurrentBuffer(parser->Scanner);
    cmDependsFortran_yy_delete_buffer(current, parser->Scanner);
    cmDependsFortran_yy_switch_to_buffer(f.Buffer, parser->Scanner);
    return 1;
    }
}